

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_lights::save_v12(xr_scene_lights *this,xr_ini_writer *w)

{
  void *pvVar1;
  xr_custom_object_vec *this_00;
  xr_scene *this_01;
  size_t in_RCX;
  void *__buf;
  xr_ini_writer *w_local;
  xr_scene_lights *this_local;
  
  xr_ini_writer::open_section(w,"lcontrols");
  xr_ini_writer::
  w_ini_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_ini_token>(w);
  xr_ini_writer::close_section(w);
  xr_ini_writer::open_section(w,"main");
  xr_ini_writer::write(w,0x2e40af,(void *)(ulong)this->m_flags,in_RCX);
  pvVar1 = (void *)std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::size
                             (&this->m_controls);
  xr_ini_writer::write(w,0x2e2da1,pvVar1,in_RCX);
  this_00 = xr_scene_objects::objects(&this->super_xr_scene_objects);
  pvVar1 = (void *)std::
                   vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                   ::size(this_00);
  xr_ini_writer::write(w,0x2e29b5,pvVar1,in_RCX);
  xr_ini_writer::write(w,0x2e2db3,__buf,in_RCX);
  xr_ini_writer::write(w,0x2e4e39,(void *)0x0,in_RCX);
  xr_ini_writer::close_section(w);
  this_01 = xr_scene_part::scene((xr_scene_part *)this);
  xr_scene::write_revision(this_01,w,true);
  xr_scene_objects::save_v12(&this->super_xr_scene_objects,w);
  return;
}

Assistant:

void xr_scene_lights::save_v12(xr_ini_writer* w) const
{
	w->open_section("lcontrols");
	w->w_ini_seq(m_controls, write_ini_token());
	w->close_section();

	w->open_section("main");
	w->write("flags", this->m_flags);
	w->write("lcontrol_last_idx", this->m_controls.size());
	w->write("objects_count", this->objects().size());
	w->write("sun_shadow_dir", this->m_sun);
	w->write("version", 0);
	w->close_section();

	scene().write_revision(w);

	xr_scene_objects::save_v12(w);
}